

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stty.c
# Opt level: O0

sexp_conflict
sexp_termios_set_c_lflag
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x,sexp_conflict v)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint *in_RCX;
  long in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  undefined4 local_48;
  undefined4 local_40;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) &&
     (auVar1._8_8_ = (long)*(ulong *)(in_RSI + 0x30) >> 0x3f,
     auVar1._0_8_ = *(ulong *)(in_RSI + 0x30) & 0xfffffffffffffffe,
     (ulong)*in_RCX == SUB168(auVar1 / SEXT816(2),0))) {
    if ((((ulong)in_R8 & 1) == 1) || ((((ulong)in_R8 & 3) == 0 && (*in_R8 == 0xc)))) {
      if (((ulong)in_R8 & 1) == 1) {
        auVar3._8_8_ = (long)in_R8 >> 0x3f;
        auVar3._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
        local_40 = SUB164(auVar3 / SEXT816(2),0);
      }
      else {
        if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xc)) {
          local_48 = (undefined4)*(undefined8 *)(in_R8 + 6);
        }
        else {
          local_48 = 0;
        }
        local_40 = local_48;
      }
      *(undefined4 *)(*(long *)(in_RCX + 6) + 0xc) = local_40;
      local_8 = (sexp_conflict)0x43e;
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
  }
  else {
    auVar2._8_8_ = (long)*(ulong *)(in_RSI + 0x30) >> 0x3f;
    auVar2._0_8_ = *(ulong *)(in_RSI + 0x30) & 0xfffffffffffffffe;
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,SUB168(auVar2 / SEXT816(2),0),in_RCX)
    ;
  }
  return local_8;
}

Assistant:

sexp sexp_termios_set_c_lflag (sexp ctx, sexp self, sexp_sint_t n, sexp x, sexp v) {
  if (! (sexp_pointerp(x) && (sexp_pointer_tag(x) == sexp_unbox_fixnum(sexp_opcode_arg1_type(self)))))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_opcode_arg1_type(self)), x);
  if (! sexp_exact_integerp(v))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, v);
  ((struct termios*)sexp_cpointer_value(x))->c_lflag = sexp_uint_value(v);
  return SEXP_VOID;
}